

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O0

void __thiscall FThinkerIterator::FThinkerIterator(FThinkerIterator *this,PClass *type,int statnum)

{
  DThinker *pDVar1;
  int statnum_local;
  PClass *type_local;
  FThinkerIterator *this_local;
  
  if ((uint)statnum < 0x80) {
    this->m_Stat = (BYTE)statnum;
    this->m_SearchStats = false;
  }
  else {
    this->m_Stat = ' ';
    this->m_SearchStats = true;
  }
  this->m_ParentType = type;
  pDVar1 = FThinkerList::GetHead(DThinker::Thinkers + this->m_Stat);
  this->m_CurrThinker = pDVar1;
  this->m_SearchingFresh = false;
  return;
}

Assistant:

FThinkerIterator::FThinkerIterator (const PClass *type, int statnum)
{
	if ((unsigned)statnum > MAX_STATNUM)
	{
		m_Stat = STAT_FIRST_THINKING;
		m_SearchStats = true;
	}
	else
	{
		m_Stat = statnum;
		m_SearchStats = false;
	}
	m_ParentType = type;
	m_CurrThinker = DThinker::Thinkers[m_Stat].GetHead();
	m_SearchingFresh = false;
}